

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMfs.c
# Opt level: O3

Sfm_Ntk_t * Gia_ManExtractMfs(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *pVVar2;
  Tim_Man_t *pTVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  Vec_Wrd_t *pVVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  Vec_Wrd_t *p_00;
  word *pwVar13;
  Sfm_Ntk_t *pSVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  Vec_Int_t *p_01;
  Vec_Str_t *vEmpty;
  char *__assertion;
  uint uVar20;
  uint uVar21;
  int iVar22;
  size_t __n;
  int **ppiVar23;
  size_t __size;
  Vec_Wec_t *vFanins;
  ulong uVar24;
  int local_144;
  int local_138;
  int local_130;
  int nBbIns;
  long local_128;
  Vec_Str_t *local_120;
  Vec_Wrd_t *local_118;
  int local_110;
  int nBbOuts;
  Vec_Wrd_t *local_108;
  Vec_Int_t *local_100;
  Vec_Int_t *local_f8;
  uint local_ec;
  ulong local_e8;
  Vec_Str_t *local_e0;
  word uTruth;
  Vec_Wec_t *local_d0;
  int local_c4;
  Tim_Man_t *local_c0;
  Vec_Int_t *local_b8;
  Vec_Int_t *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  int local_8c;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68 [7];
  
  local_68[0] = 0xaaaaaaaaaaaaaaaa;
  local_68[1] = 0xcccccccccccccccc;
  local_68[2] = 0xf0f0f0f0f0f0f0f0;
  local_68[3] = 0xff00ff00ff00ff00;
  local_68[4] = 0xffff0000ffff0000;
  local_68[5] = 0xffffffff00000000;
  pTVar3 = (Tim_Man_t *)p->pManTime;
  local_c4 = Gia_ManBoxNum(p);
  local_c0 = pTVar3;
  if (local_c4 == 0) {
    local_130 = p->vCis->nSize - p->nRegs;
    local_110 = p->vCos->nSize - p->nRegs;
  }
  else {
    local_130 = Tim_ManPiNum(pTVar3);
    local_110 = Tim_ManPoNum(pTVar3);
  }
  nBbIns = 0;
  nBbOuts = 0;
  iVar6 = Gia_ManLutSizeMax(p);
  iVar7 = 6;
  if (6 < iVar6) {
    iVar7 = iVar6;
  }
  if (0xf < iVar6) {
    __assert_fail("nLutSizeMax < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                  ,0x4a,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
  }
  local_128 = CONCAT44(local_128._4_4_,iVar7);
  uVar21 = 0;
  if (local_c0 != (Tim_Man_t *)0x0) {
    Tim_ManBlackBoxIoNum(local_c0,&nBbIns,&nBbOuts);
    uVar21 = nBbOuts;
  }
  iVar7 = p->vCis->nSize;
  iVar6 = Gia_ManLutNum(p);
  uVar20 = iVar6 + iVar7;
  uVar19 = p->vCos->nSize;
  local_a8 = (ulong)uVar19;
  uVar16 = (ulong)(uint)nBbIns;
  iVar7 = uVar19 + nBbIns + uVar20;
  local_b0 = (Vec_Int_t *)(ulong)(uint)nBbOuts;
  iVar6 = nBbOuts + iVar7 + 1;
  uVar19 = iVar7 + nBbOuts;
  local_d0 = (Vec_Wec_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < uVar19) {
    iVar7 = iVar6;
  }
  local_d0->nCap = iVar7;
  local_e8 = (ulong)uVar20;
  local_a0 = uVar16;
  if (iVar7 == 0) {
    local_f8 = (Vec_Int_t *)0x0;
  }
  else {
    local_f8 = (Vec_Int_t *)calloc((long)iVar7,0x10);
  }
  local_d0->pArray = local_f8;
  local_d0->nSize = iVar6;
  local_e0 = (Vec_Str_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < uVar19) {
    iVar7 = iVar6;
  }
  local_e0->nCap = iVar7;
  __size = (size_t)iVar7;
  if (iVar7 == 0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = (char *)malloc(__size);
  }
  local_e0->pArray = pcVar8;
  local_e0->nSize = iVar6;
  __n = (size_t)iVar6;
  pcVar9 = (char *)0x0;
  memset(pcVar8,0,__n);
  local_120 = (Vec_Str_t *)malloc(0x10);
  local_120->nCap = iVar7;
  if (iVar7 != 0) {
    pcVar9 = (char *)malloc(__size);
  }
  local_120->pArray = pcVar9;
  local_120->nSize = iVar6;
  pVVar10 = (Vec_Wrd_t *)0x0;
  memset(pcVar9,0,__n);
  local_108 = (Vec_Wrd_t *)malloc(0x10);
  local_108->nCap = iVar7;
  if (iVar7 != 0) {
    pVVar10 = (Vec_Wrd_t *)malloc(__size * 8);
  }
  local_108->pArray = (word *)pVVar10;
  local_108->nSize = iVar6;
  local_118 = pVVar10;
  memset(pVVar10,0,__n * 8);
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = iVar7;
  local_b8 = pVVar11;
  if (iVar7 == 0) {
    pVVar11->pArray = (int *)0x0;
    pVVar11->nSize = iVar6;
  }
  else {
    piVar12 = (int *)malloc(__size << 2);
    pVVar11->pArray = piVar12;
    pVVar11->nSize = iVar6;
    if (piVar12 != (int *)0x0) {
      memset(piVar12,0,__n << 2);
    }
  }
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  p_00->nCap = 10000;
  p_00->nSize = 0;
  pwVar13 = (word *)malloc(80000);
  pVVar10 = local_118;
  p_00->pArray = pwVar13;
  uVar19 = p->nObjs;
  if ((p->vCopies).nCap < (int)uVar19) {
    piVar12 = (p->vCopies).pArray;
    if (piVar12 == (int *)0x0) {
      piVar12 = (int *)malloc((long)(int)uVar19 << 2);
    }
    else {
      piVar12 = (int *)realloc(piVar12,(long)(int)uVar19 << 2);
    }
    (p->vCopies).pArray = piVar12;
    if (piVar12 == (int *)0x0) {
LAB_0077ca58:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar19;
  }
  if (0 < (int)uVar19) {
    memset((p->vCopies).pArray,0xff,(ulong)uVar19 * 4);
  }
  (p->vCopies).nSize = uVar19;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    piVar12 = pVVar11->pArray;
    lVar15 = 0;
    do {
      iVar7 = piVar12[lVar15];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_0077c99e;
      if (iVar7 == 0) break;
      if ((p->vCopies).nSize <= iVar7) goto LAB_0077cad4;
      (p->vCopies).pArray[iVar7] = uVar21 + (int)lVar15;
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar11->nSize);
    uVar21 = uVar21 + (int)lVar15;
  }
  if (((int)uVar21 < 0) || (iVar6 <= (int)uVar21)) {
LAB_0077c9fb:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
  }
  pcVar8[uVar21] = '\x01';
  *(undefined8 *)(&pVVar10->nCap + (ulong)uVar21 * 2) = 0;
  if ((p->vCopies).nSize < 1) {
LAB_0077cad4:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *(p->vCopies).pArray = uVar21;
  uVar21 = uVar21 + 1;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 0x10;
  pVVar11->nSize = 0;
  piVar12 = (int *)malloc(0x40);
  pVVar11->pArray = piVar12;
  local_100 = pVVar11;
  Gia_ObjComputeTruthTableStart(p,(int)local_128);
  iVar7 = p->nObjs;
  vEmpty = local_120;
  local_118 = p_00;
  if (1 < iVar7) {
    lVar15 = 1;
    do {
      pVVar2 = local_100;
      pVVar11 = p->vMapping;
      if (pVVar11->nSize <= lVar15) goto LAB_0077c97f;
      piVar12 = pVVar11->pArray;
      if (piVar12[lVar15] != 0) {
        local_100->nSize = 0;
        if (((int)uVar21 < 0) || (iVar6 <= (int)uVar21)) goto LAB_0077c9dc;
        uVar19 = pVVar11->nSize;
        lVar17 = (long)(int)uVar19;
        if (lVar17 <= lVar15) goto LAB_0077c97f;
        uVar20 = piVar12[lVar15];
        if (((long)(int)uVar20 < 0) || (uVar19 <= uVar20)) goto LAB_0077c97f;
        p_01 = local_f8 + uVar21;
        iVar7 = piVar12[(int)uVar20];
        if (p_01->nCap < iVar7) {
          if (p_01->pArray == (int *)0x0) {
            piVar12 = (int *)malloc((long)iVar7 << 2);
          }
          else {
            piVar12 = (int *)realloc(p_01->pArray,(long)iVar7 << 2);
          }
          p_01->pArray = piVar12;
          if (piVar12 == (int *)0x0) goto LAB_0077ca58;
          p_01->nCap = iVar7;
          pVVar11 = p->vMapping;
          uVar19 = pVVar11->nSize;
          lVar17 = (long)(int)uVar19;
        }
        uVar16 = (ulong)uVar19;
        if (lVar17 <= lVar15) goto LAB_0077c97f;
        lVar17 = 0;
        while( true ) {
          piVar12 = pVVar11->pArray;
          lVar18 = (long)piVar12[lVar15];
          if ((lVar18 < 0) || ((uint)uVar16 <= (uint)piVar12[lVar15])) goto LAB_0077c97f;
          if (piVar12[lVar18] <= lVar17) break;
          iVar7 = piVar12[lVar18 + lVar17 + 1];
          if (((long)iVar7 < 0) || ((p->vCopies).nSize <= iVar7)) goto LAB_0077c97f;
          iVar22 = (p->vCopies).pArray[iVar7];
          if (iVar22 < 0) {
            __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                          ,0x69,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
          }
          Vec_IntPush(p_01,iVar22);
          Vec_IntPush(pVVar2,iVar7);
          lVar17 = lVar17 + 1;
          pVVar11 = p->vMapping;
          uVar16 = (ulong)pVVar11->nSize;
          if ((long)uVar16 <= lVar15) goto LAB_0077c97f;
        }
        if (0xf < pVVar2->nSize) {
          __assert_fail("Vec_IntSize(vLeaves) < 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x6d,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        if (pVVar2->nSize != piVar12[lVar18]) {
          __assert_fail("Vec_IntSize(vLeaves) == Gia_ObjLutSize(p, Id)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                        ,0x6e,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
        }
        if (p->nObjs <= lVar15) goto LAB_0077c99e;
        pwVar13 = Gia_ObjComputeTruthTableCut(p,p->pObjs + lVar15,pVVar2);
        iVar7 = Abc_TtMinBase(pwVar13,p_01->pArray,p_01->nSize,pVVar2->nSize);
        pVVar10 = local_118;
        if (p_01->nSize < iVar7) {
LAB_0077cab5:
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        p_01->nSize = iVar7;
        if (iVar7 < 7) {
          if (local_108->nSize <= (int)uVar21) goto LAB_0077ca39;
          local_108->pArray[uVar21] = *pwVar13;
        }
        else {
          uVar19 = 1 << ((byte)(iVar7 + -6) & 0x1f);
          if (local_b8->nSize <= (int)uVar21) goto LAB_0077cad4;
          local_b8->pArray[uVar21] = local_118->nSize;
          if (iVar7 + -6 != 0x1f) {
            if ((int)uVar19 < 2) {
              uVar19 = 1;
            }
            uVar16 = 0;
            do {
              Vec_WrdPush(pVVar10,pwVar13[uVar16]);
              uVar16 = uVar16 + 1;
            } while (uVar19 != uVar16);
          }
        }
        uVar19 = p->vMapping->nSize;
        if ((int)uVar19 <= lVar15) goto LAB_0077c97f;
        piVar12 = p->vMapping->pArray;
        uVar20 = piVar12[lVar15];
        if (((long)(int)uVar20 < 0) || (uVar19 <= uVar20)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar12 = piVar12 + (int)uVar20;
        if (piVar12[(long)*piVar12 + 1] < 0) {
          if ((local_e0->nSize <= (int)uVar21) ||
             (local_e0->pArray[uVar21] = '\x01', local_120->nSize <= (int)uVar21))
          goto LAB_0077c9fb;
          local_120->pArray[uVar21] = '\x01';
        }
        if ((p->vCopies).nSize <= lVar15) goto LAB_0077cad4;
        (p->vCopies).pArray[lVar15] = uVar21;
        uVar21 = uVar21 + 1;
        iVar7 = p->nObjs;
        vEmpty = local_120;
        p_00 = local_118;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar7);
  }
  Gia_ObjComputeTruthTableStop(p);
  uVar16 = local_68[0];
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    uVar24 = (ulong)uVar21;
    ppiVar23 = &local_f8[uVar24].pArray;
    local_f8 = (Vec_Int_t *)(uVar24 * 8);
    lVar17 = 0;
    lVar15 = (long)local_110;
    pVVar10 = local_108;
    local_128 = lVar15;
    local_98 = uVar24;
    do {
      iVar7 = pVVar11->pArray[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_0077c99e:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar7;
      uVar19 = iVar7 - (*(uint *)pGVar1 & 0x1fffffff);
      if (((int)uVar19 < 0) || ((p->vCopies).nSize <= (int)uVar19)) {
LAB_0077c97f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = (p->vCopies).pArray[uVar19];
      if (iVar7 < 0) {
        __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                      ,0x89,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
      }
      if (((int)uVar21 < 0) || (iVar22 = (int)uVar24 + (int)lVar17, iVar6 <= iVar22))
      goto LAB_0077c9dc;
      piVar12 = *ppiVar23;
      if (((Vec_Int_t *)(ppiVar23 + -1))->nCap < 1) {
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)malloc(4);
        }
        else {
          piVar12 = (int *)realloc(piVar12,4);
        }
        *ppiVar23 = piVar12;
        if (piVar12 == (int *)0x0) goto LAB_0077ca58;
        ((Vec_Int_t *)(ppiVar23 + -1))->nCap = 1;
        pVVar11 = p->vCos;
        pVVar10 = local_108;
        uVar24 = local_98;
        lVar15 = local_128;
      }
      *piVar12 = iVar7;
      *(int *)((long)ppiVar23 + -4) = 1;
      if (lVar17 < pVVar11->nSize - lVar15) {
        if ((local_e0->nSize <= iVar22) ||
           (local_e0->pArray[lVar17 + uVar24] = '\x01', local_120->nSize <= iVar22))
        goto LAB_0077c9fb;
        local_120->pArray[lVar17 + uVar24] = '\x01';
        uTruth = (long)((int)(*(uint *)pGVar1 << 2) >> 0x1f) ^ uVar16;
        if (pVVar10->nSize <= iVar22) {
LAB_0077ca39:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        *(word *)((long)pVVar10->pArray + (long)local_f8 + lVar17 * 8) = uTruth;
      }
      pGVar4 = p->pObjs;
      if ((pGVar1 < pGVar4) || (pGVar4 + p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar19 = (int)((long)pGVar1 - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar19 < 0) || ((p->vCopies).nSize <= (int)uVar19)) goto LAB_0077cad4;
      (p->vCopies).pArray[uVar19 & 0x7fffffff] = iVar22;
      lVar17 = lVar17 + 1;
      pVVar11 = p->vCos;
      ppiVar23 = ppiVar23 + 2;
    } while (lVar17 < pVVar11->nSize);
    uVar21 = (int)uVar24 + (int)lVar17;
    vEmpty = local_120;
    p_00 = local_118;
  }
  vFanins = local_d0;
  if (uVar21 + nBbIns != iVar6) {
    __assert_fail("Counter == nMfsVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                  ,0x97,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
  }
  pGVar5 = p->pAigExtra;
  iVar7 = nBbIns;
  if (pGVar5 != (Gia_Man_t *)0x0) {
    iVar7 = pGVar5->vCis->nSize;
    if (0xf < iVar7) {
      __assertion = "Gia_ManCiNum(p->pAigExtra) < 16";
      pcVar9 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c";
      pcVar8 = "Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)";
      goto LAB_0077c9f1;
    }
    Gia_ObjComputeTruthTableStart(pGVar5,iVar7);
    if (local_c4 < 1) {
      local_144 = 0;
      local_128 = CONCAT44(local_128._4_4_,local_130);
      iVar7 = 0;
      local_138 = 0;
    }
    else {
      local_98 = local_68[0];
      local_80 = (ulong)((int)local_e8 + (int)local_a8 + (int)local_a0 + (int)local_b0 + 1);
      local_138 = 0;
      iVar7 = 0;
      local_144 = 0;
      local_128 = CONCAT44(local_128._4_4_,local_130);
      iVar6 = 0;
      do {
        pTVar3 = local_c0;
        iVar22 = Tim_ManBoxInputNum(local_c0,iVar6);
        local_e8 = CONCAT44(local_e8._4_4_,iVar22);
        local_ec = Tim_ManBoxOutputNum(pTVar3,iVar6);
        uVar16 = local_e8;
        uVar21 = (uint)local_e8;
        local_8c = iVar6;
        iVar6 = Tim_ManBoxIsBlack(pTVar3,iVar6);
        if (iVar6 == 0) {
          local_100->nSize = 0;
          if (0 < (int)uVar21) {
            uVar24 = 0;
            do {
              pVVar11 = p->pAigExtra->vCis;
              if ((long)pVVar11->nSize <= (long)uVar24) goto LAB_0077c97f;
              iVar6 = pVVar11->pArray[uVar24];
              if ((iVar6 < 0) || (p->pAigExtra->nObjs <= iVar6)) goto LAB_0077c99e;
              Vec_IntPush(local_100,iVar6);
              uVar24 = uVar24 + 1;
            } while ((uVar16 & 0xffffffff) != uVar24);
          }
          if (0 < (int)local_ec) {
            local_88 = (long)(int)uVar21 << 2;
            local_a8 = CONCAT44(local_a8._4_4_,(int)local_128 - local_130);
            local_70 = (long)local_144;
            local_a0 = (long)(int)local_128;
            local_b0 = (Vec_Int_t *)(ulong)local_ec;
            local_78 = uVar16 & 0xffffffff;
            pVVar11 = (Vec_Int_t *)0x0;
            do {
              if ((int)local_128 < 0) goto LAB_0077c97f;
              lVar15 = (long)&pVVar11->nCap + local_a0;
              if (p->vCis->nSize <= lVar15) goto LAB_0077c97f;
              iVar6 = p->vCis->pArray[lVar15];
              if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0077c99e;
              if ((p->vCopies).nSize <= iVar6) goto LAB_0077c97f;
              iVar6 = (p->vCopies).pArray[iVar6];
              lVar15 = (long)iVar6;
              if ((lVar15 < 0) || (local_d0->nSize <= iVar6)) goto LAB_0077c9dc;
              pVVar2 = local_d0->pArray + lVar15;
              local_f8 = pVVar11;
              if (local_d0->pArray[lVar15].nCap < (int)uVar21) {
                if (pVVar2->pArray == (int *)0x0) {
                  piVar12 = (int *)malloc(local_88);
                }
                else {
                  piVar12 = (int *)realloc(pVVar2->pArray,local_88);
                }
                pVVar2->pArray = piVar12;
                if (piVar12 == (int *)0x0) goto LAB_0077ca58;
                pVVar2->nCap = uVar21;
              }
              lVar17 = local_70;
              uVar16 = local_78;
              if (0 < (int)uVar21) {
                do {
                  if ((local_144 < 0) || (p->vCos->nSize <= lVar17)) goto LAB_0077c97f;
                  iVar22 = p->vCos->pArray[lVar17];
                  if (((long)iVar22 < 0) || (p->nObjs <= iVar22)) goto LAB_0077c99e;
                  if ((p->vCopies).nSize <= iVar22) goto LAB_0077c97f;
                  iVar22 = (p->vCopies).pArray[iVar22];
                  if (iVar22 < 0) {
                    __assert_fail("Gia_ObjCopyArray(p, iFan) >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                                  ,0xb6,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
                  }
                  Vec_IntPush(pVVar2,iVar22);
                  uVar16 = uVar16 - 1;
                  lVar17 = lVar17 + 1;
                } while (uVar16 != 0);
              }
              pVVar11 = local_100;
              if (local_e0->nSize <= iVar6) goto LAB_0077c9fb;
              local_e0->pArray[lVar15] = '\x01';
              uVar21 = (int)local_a8 + (int)local_f8;
              if ((int)uVar21 < 0) goto LAB_0077c97f;
              pGVar5 = p->pAigExtra;
              if (pGVar5->vCos->nSize <= (int)uVar21) goto LAB_0077c97f;
              uVar21 = pGVar5->vCos->pArray[uVar21];
              if (((long)(int)uVar21 < 0) || (pGVar5->nObjs <= (int)uVar21)) goto LAB_0077c99e;
              pGVar1 = pGVar5->pObjs + (int)uVar21;
              if (uVar21 == ((uint)*(undefined8 *)pGVar1 & 0x1fffffff)) {
                uTruth = (word)((*(int *)pGVar1 << 2) >> 0x1f);
LAB_0077c659:
                pwVar13 = &uTruth;
              }
              else {
                uVar16 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
                if (((uint)*(undefined8 *)(pGVar1 + -uVar16) & 0x9fffffff) == 0x9fffffff) {
                  uTruth = (long)((*(int *)pGVar1 << 2) >> 0x1f) ^
                           *(ulong *)((long)local_68 +
                                     (ulong)(uint)((int)((ulong)*(undefined8 *)(pGVar1 + -uVar16) >>
                                                        0x20) << 3));
                  goto LAB_0077c659;
                }
                pwVar13 = Gia_ObjComputeTruthTableCut(pGVar5,pGVar1 + -uVar16,local_100);
                if ((pGVar1->field_0x3 & 0x20) != 0) {
                  uVar21 = 1 << ((char)pVVar11->nSize - 6U & 0x1f);
                  if (pVVar11->nSize < 7) {
                    uVar21 = 1;
                  }
                  if (0 < (int)uVar21) {
                    uVar16 = 0;
                    do {
                      pwVar13[uVar16] = ~pwVar13[uVar16];
                      uVar16 = uVar16 + 1;
                    } while (uVar21 != uVar16);
                  }
                }
              }
              vEmpty = local_120;
              iVar22 = Abc_TtMinBase(pwVar13,pVVar2->pArray,pVVar2->nSize,local_100->nSize);
              p_00 = local_118;
              if (pVVar2->nSize < iVar22) goto LAB_0077cab5;
              pVVar2->nSize = iVar22;
              if (iVar22 < 7) {
                if (local_108->nSize <= iVar6) goto LAB_0077ca39;
                local_108->pArray[lVar15] = *pwVar13;
              }
              else {
                uVar21 = 1 << ((byte)(iVar22 + -6) & 0x1f);
                if (local_b8->nSize <= iVar6) goto LAB_0077cad4;
                local_b8->pArray[lVar15] = local_118->nSize;
                if (iVar22 + -6 != 0x1f) {
                  if ((int)uVar21 < 2) {
                    uVar21 = 1;
                  }
                  uVar16 = 0;
                  do {
                    Vec_WrdPush(p_00,pwVar13[uVar16]);
                    uVar16 = uVar16 + 1;
                  } while (uVar21 != uVar16);
                }
              }
              pVVar11 = (Vec_Int_t *)((long)&local_f8->nCap + 1);
              uVar21 = (uint)local_e8;
            } while (pVVar11 != local_b0);
          }
LAB_0077c78c:
          vFanins = local_d0;
          if (0 < (int)uVar21) {
            lVar15 = (long)local_144;
            uVar16 = (ulong)uVar21;
            do {
              if ((local_144 < 0) || (p->vCos->nSize <= lVar15)) goto LAB_0077c97f;
              iVar6 = p->vCos->pArray[lVar15];
              if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0077c99e;
              uVar19 = (uint)*(undefined8 *)(p->pObjs + iVar6);
              if (((undefined1  [12])(p->pObjs + iVar6)[-(ulong)(uVar19 & 0x1fffffff)] &
                  (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff) {
                uVar19 = iVar6 - (uVar19 & 0x1fffffff);
                if (((int)uVar19 < 0) || ((p->vCopies).nSize <= (int)uVar19)) goto LAB_0077c97f;
                iVar6 = (p->vCopies).pArray[uVar19];
                if (((long)iVar6 < 0) || (vEmpty->nSize <= iVar6)) goto LAB_0077c9fb;
                vEmpty->pArray[iVar6] = '\x01';
              }
              lVar15 = lVar15 + 1;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
        }
        else {
          if (0 < (int)local_ec) {
            lVar15 = (long)(int)local_128;
            uVar16 = (ulong)local_ec;
            pVVar10 = local_108;
            do {
              if (((int)local_128 < 0) || (p->vCis->nSize <= lVar15)) goto LAB_0077c97f;
              iVar6 = p->vCis->pArray[lVar15];
              if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0077c99e;
              if ((p->vCopies).nSize <= iVar6) goto LAB_0077c97f;
              iVar6 = (p->vCopies).pArray[iVar6];
              lVar17 = (long)iVar6;
              if ((lVar17 < 0) || (vFanins->nSize <= iVar6)) goto LAB_0077c9dc;
              if (vFanins->pArray[lVar17].nSize != 0) {
                __assert_fail("Vec_IntSize(vArray) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                              ,0xe9,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
              }
              pVVar11 = vFanins->pArray + lVar17;
              piVar12 = pVVar11->pArray;
              if (pVVar11->nCap < 1) {
                if (piVar12 == (int *)0x0) {
                  piVar12 = (int *)malloc(4);
                }
                else {
                  piVar12 = (int *)realloc(piVar12,4);
                }
                pVVar11->pArray = piVar12;
                if (piVar12 == (int *)0x0) goto LAB_0077ca58;
                pVVar11->nCap = 1;
                pVVar10 = local_108;
              }
              *piVar12 = local_138;
              pVVar11->nSize = 1;
              if ((local_e0->nSize <= iVar6) ||
                 (local_e0->pArray[lVar17] = '\x01', local_120->nSize <= iVar6)) goto LAB_0077c9fb;
              local_120->pArray[lVar17] = '\x01';
              if (pVVar10->nSize <= iVar6) goto LAB_0077ca39;
              pVVar10->pArray[lVar17] = local_98;
              lVar15 = lVar15 + 1;
              local_138 = local_138 + 1;
              uVar16 = uVar16 - 1;
              vEmpty = local_120;
              p_00 = local_118;
            } while (uVar16 != 0);
          }
          uVar21 = (uint)local_e8;
          if (0 < (int)(uint)local_e8) {
            lVar15 = (long)local_144;
            uVar16 = local_e8 & 0xffffffff;
            iVar6 = (int)local_80 + iVar7;
            do {
              if ((local_144 < 0) || (p->vCos->nSize <= lVar15)) goto LAB_0077c97f;
              iVar22 = p->vCos->pArray[lVar15];
              if (((long)iVar22 < 0) || (p->nObjs <= iVar22)) goto LAB_0077c99e;
              if ((p->vCopies).nSize <= iVar22) goto LAB_0077c97f;
              uVar21 = iVar6 - nBbIns;
              if (((int)uVar21 < 0) || (vFanins->nSize <= (int)uVar21)) goto LAB_0077c9dc;
              if (vFanins->pArray[uVar21].nSize != 0) {
                __assert_fail("Vec_IntSize(vArray) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                              ,0xf6,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
              }
              iVar22 = (p->vCopies).pArray[iVar22];
              pVVar11 = vFanins->pArray + uVar21;
              piVar12 = pVVar11->pArray;
              if (pVVar11->nCap < 1) {
                if (piVar12 == (int *)0x0) {
                  piVar12 = (int *)malloc(4);
                }
                else {
                  piVar12 = (int *)realloc(piVar12,4);
                }
                pVVar11->pArray = piVar12;
                if (piVar12 == (int *)0x0) goto LAB_0077ca58;
                pVVar11->nCap = 1;
              }
              *piVar12 = iVar22;
              pVVar11->nSize = 1;
              lVar15 = lVar15 + 1;
              iVar6 = iVar6 + 1;
              iVar7 = iVar7 + 1;
              uVar16 = uVar16 - 1;
              vFanins = local_d0;
            } while (uVar16 != 0);
            vEmpty = local_120;
            p_00 = local_118;
            uVar21 = (uint)local_e8;
            goto LAB_0077c78c;
          }
        }
        local_144 = local_144 + uVar21;
        local_128 = CONCAT44(local_128._4_4_,(int)local_128 + local_ec);
        iVar6 = local_8c + 1;
      } while (iVar6 != local_c4);
    }
    Gia_ObjComputeTruthTableStop(p->pAigExtra);
    if ((int)local_128 != p->vCis->nSize) {
      __assert_fail("curCi == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x109,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    if (local_144 + local_110 != p->vCos->nSize) {
      __assert_fail("curCo == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10a,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    if ((int)local_128 - local_130 != p->pAigExtra->vCos->nSize) {
      __assert_fail("curCi - nRealPis == Gia_ManCoNum(p->pAigExtra)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10b,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    if (iVar7 != nBbIns) {
      __assert_fail("iBbIn == nBbIns",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10c,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
    if (local_138 != nBbOuts) {
      __assert_fail("iBbOut == nBbOuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMfs.c"
                    ,0x10d,"Sfm_Ntk_t *Gia_ManExtractMfs(Gia_Man_t *)");
    }
  }
  if (local_100->pArray != (int *)0x0) {
    free(local_100->pArray);
    iVar7 = nBbIns;
  }
  free(local_100);
  pSVar14 = Sfm_NtkConstruct(vFanins,local_130 + nBbOuts,iVar7 + local_110,local_e0,vEmpty,local_108
                             ,local_b8,p_00);
  return pSVar14;
LAB_0077c9dc:
  __assertion = "i >= 0 && i < p->nSize";
  pcVar9 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h";
  pcVar8 = "Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)";
LAB_0077c9f1:
  __assert_fail(__assertion,pcVar9,0x9c,pcVar8);
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sfm_Ntk_t * Gia_ManExtractMfs( Gia_Man_t * p )
{
    word uTruth, * pTruth, uTruths6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    Gia_Obj_t * pObj, * pObjExtra;
    Vec_Wec_t * vFanins; // mfs data
    Vec_Str_t * vFixed;  // mfs data 
    Vec_Str_t * vEmpty;  // mfs data
    Vec_Wrd_t * vTruths; // mfs data
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Vec_Int_t * vLeaves;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    int nBoxes   = Gia_ManBoxNum(p), nVars;
    int nRealPis = nBoxes ? Tim_ManPiNum(pManTime) : Gia_ManPiNum(p);
    int nRealPos = nBoxes ? Tim_ManPoNum(pManTime) : Gia_ManPoNum(p);
    int i, j, k, curCi, curCo, nBoxIns, nBoxOuts;
    int Id, iFan, nMfsVars, nBbIns = 0, nBbOuts = 0, Counter = 0;
    int nLutSizeMax = Gia_ManLutSizeMax( p );
    nLutSizeMax = Abc_MaxInt( nLutSizeMax, 6 );
    assert( nLutSizeMax < 16 );
    //assert( !p->pAigExtra || Gia_ManPiNum(p->pAigExtra) <= 6 );
    if ( pManTime ) Tim_ManBlackBoxIoNum( pManTime, &nBbIns, &nBbOuts );
    // skip PIs due to box outputs
    Counter += nBbOuts;
    // prepare storage
    nMfsVars = Gia_ManCiNum(p) + 1 + Gia_ManLutNum(p) + Gia_ManCoNum(p) + nBbIns + nBbOuts;
    vFanins  = Vec_WecStart( nMfsVars );
    vFixed   = Vec_StrStart( nMfsVars );
    vEmpty   = Vec_StrStart( nMfsVars );
    vTruths  = Vec_WrdStart( nMfsVars );
    vStarts  = Vec_IntStart( nMfsVars );
    vTruths2 = Vec_WrdAlloc( 10000 );
    // set internal PIs
    Gia_ManCleanCopyArray( p );
    Gia_ManForEachCiId( p, Id, i )
        Gia_ObjSetCopyArray( p, Id, Counter++ );
    // set constant node
    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
    Vec_WrdWriteEntry( vTruths, Counter, (word)0 );
    Gia_ObjSetCopyArray( p, 0, Counter++ );
    // set internal LUTs
    vLeaves = Vec_IntAlloc( nLutSizeMax );
    Gia_ObjComputeTruthTableStart( p, nLutSizeMax );
    Gia_ManForEachLut( p, Id )
    {
        Vec_IntClear( vLeaves );
        vArray = Vec_WecEntry( vFanins, Counter );
        Vec_IntGrow( vArray, Gia_ObjLutSize(p, Id) );
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            assert( Gia_ObjCopyArray(p, iFan) >= 0 );
            Vec_IntPush( vArray, Gia_ObjCopyArray(p, iFan) );
            Vec_IntPush( vLeaves, iFan );
        }
        assert( Vec_IntSize(vLeaves) < 16 );
        assert( Vec_IntSize(vLeaves) == Gia_ObjLutSize(p, Id) );
//        uTruth = *Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, Id), vLeaves );
//        nVars = Abc_Tt6MinBase( &uTruth, Vec_IntArray(vArray), Vec_IntSize(vArray) );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, Id), vLeaves );
        nVars = Abc_TtMinBase( pTruth, Vec_IntArray(vArray), Vec_IntSize(vArray), Vec_IntSize(vLeaves) );
        Vec_IntShrink( vArray, nVars );
        if ( nVars <= 6 )
            Vec_WrdWriteEntry( vTruths, Counter, pTruth[0] );
        else
        {
            int w, nWords = Abc_Truth6WordNum( nVars );
            Vec_IntWriteEntry( vStarts, Counter, Vec_WrdSize(vTruths2) );
            for ( w = 0; w < nWords; w++ )
                Vec_WrdPush( vTruths2, pTruth[w] );
        }
        if ( Gia_ObjLutIsMux(p, Id) )
        {
            Vec_StrWriteEntry( vFixed, Counter, (char)1 );
            Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
        }
        Gia_ObjSetCopyArray( p, Id, Counter++ );
    }
    Gia_ObjComputeTruthTableStop( p );
    // set all POs
    Gia_ManForEachCo( p, pObj, i )
    {
        iFan = Gia_ObjFaninId0p( p, pObj );
        assert( Gia_ObjCopyArray(p, iFan) >= 0 );
        vArray = Vec_WecEntry( vFanins, Counter );
        Vec_IntFill( vArray, 1, Gia_ObjCopyArray(p, iFan) );
        if ( i < Gia_ManCoNum(p) - nRealPos ) // internal PO
        {
            Vec_StrWriteEntry( vFixed, Counter, (char)1 );
            Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
            uTruth = Gia_ObjFaninC0(pObj) ? ~uTruths6[0]: uTruths6[0];
            Vec_WrdWriteEntry( vTruths, Counter, uTruth );
        }
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), Counter++ );
    }
    // skip POs due to box inputs
    Counter += nBbIns;
    assert( Counter == nMfsVars );
    // add functions of the boxes
    if ( p->pAigExtra )
    {
        int iBbIn = 0, iBbOut = 0;
        assert( Gia_ManCiNum(p->pAigExtra) < 16 );
        Gia_ObjComputeTruthTableStart( p->pAigExtra, Gia_ManCiNum(p->pAigExtra) );
        curCi = nRealPis;
        curCo = 0;
        for ( k = 0; k < nBoxes; k++ )
        {
            nBoxIns = Tim_ManBoxInputNum( pManTime, k );
            nBoxOuts = Tim_ManBoxOutputNum( pManTime, k );
            // iterate through box outputs
            if ( !Tim_ManBoxIsBlack(pManTime, k) ) //&& Tim_ManBoxInputNum(pManTime, k) <= 6 )
            {
                // collect truth table leaves
                Vec_IntClear( vLeaves );
                for ( i = 0; i < nBoxIns; i++ )
                    Vec_IntPush( vLeaves, Gia_ObjId(p->pAigExtra, Gia_ManCi(p->pAigExtra, i)) );
                for ( j = 0; j < nBoxOuts; j++ )
                {
                    // CI corresponding to the box outputs
                    pObj = Gia_ManCi( p, curCi + j );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // add box inputs (POs of the AIG) as fanins
                    vArray = Vec_WecEntry( vFanins, Counter );
                    Vec_IntGrow( vArray, nBoxIns );
                    for ( i = 0; i < nBoxIns; i++ )
                    {
                        iFan = Gia_ObjId( p, Gia_ManCo(p, curCo + i) );
                        assert( Gia_ObjCopyArray(p, iFan) >= 0 );
                        Vec_IntPush( vArray, Gia_ObjCopyArray(p, iFan) );
                    }
                    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
                    // box output in the extra manager
                    pObjExtra = Gia_ManCo( p->pAigExtra, curCi - nRealPis + j );
                    // compute truth table
                    pTruth = NULL;
                    if ( Gia_ObjFaninId0p(p->pAigExtra, pObjExtra) == 0 )
                    {
                        uTruth = 0;
                        uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                        pTruth = &uTruth;
                    }
                    else if ( Gia_ObjIsCi(Gia_ObjFanin0(pObjExtra)) )
                    {
                        uTruth = uTruths6[Gia_ObjCioId(Gia_ObjFanin0(pObjExtra))];
                        uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                        pTruth = &uTruth;
                    }
                    else
                    {
                        pTruth = Gia_ObjComputeTruthTableCut( p->pAigExtra, Gia_ObjFanin0(pObjExtra), vLeaves );
                        if ( Gia_ObjFaninC0(pObjExtra) )
                            Abc_TtNot( pTruth, Abc_Truth6WordNum(Vec_IntSize(vLeaves)) );
                    }
                    //uTruth = Gia_ObjFaninC0(pObjExtra) ? ~uTruth : uTruth;
                    //Dau_DsdPrintFromTruth( &uTruth, Vec_IntSize(vArray) );
                    //nVars = Abc_Tt6MinBase( &uTruth, Vec_IntArray(vArray), Vec_IntSize(vArray) );
                    nVars = Abc_TtMinBase( pTruth, Vec_IntArray(vArray), Vec_IntSize(vArray), Vec_IntSize(vLeaves) );
                    Vec_IntShrink( vArray, nVars );
                    if ( nVars <= 6 )
                        Vec_WrdWriteEntry( vTruths, Counter, pTruth[0] );
                    else
                    {
                        int w, nWords = Abc_Truth6WordNum( nVars );
                        Vec_IntWriteEntry( vStarts, Counter, Vec_WrdSize(vTruths2) );
                        for ( w = 0; w < nWords; w++ )
                            Vec_WrdPush( vTruths2, pTruth[w] );
                    }
                }
            }
            else // create buffers for black box inputs and outputs
            {
                for ( j = 0; j < nBoxOuts; j++ )
                {
                    // CI corresponding to the box outputs
                    pObj = Gia_ManCi( p, curCi + j );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // connect it with the special primary input (iBbOut)
                    vArray = Vec_WecEntry( vFanins, Counter );
                    assert( Vec_IntSize(vArray) == 0 );
                    Vec_IntFill( vArray, 1, iBbOut++ );
                    Vec_StrWriteEntry( vFixed, Counter, (char)1 );
                    Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
                    Vec_WrdWriteEntry( vTruths, Counter, uTruths6[0] );
                }
                for ( i = 0; i < nBoxIns; i++ )
                {
                    // CO corresponding to the box inputs
                    pObj = Gia_ManCo( p, curCo + i );
                    Counter = Gia_ObjCopyArray( p, Gia_ObjId(p, pObj) );
                    // connect it with the special primary output (iBbIn)
                    vArray = Vec_WecEntry( vFanins, nMfsVars - nBbIns + iBbIn++ );
                    assert( Vec_IntSize(vArray) == 0 );
                    Vec_IntFill( vArray, 1, Counter );
                }
            }
            // set internal POs pointing directly to internal PIs as no-delay
            for ( i = 0; i < nBoxIns; i++ )
            {
                pObj = Gia_ManCo( p, curCo + i );
                if ( !Gia_ObjIsCi( Gia_ObjFanin0(pObj) ) )
                    continue;
                Counter = Gia_ObjCopyArray( p, Gia_ObjFaninId0p(p, pObj) );
                Vec_StrWriteEntry( vEmpty, Counter, (char)1 );
            }
            curCo += nBoxIns;
            curCi += nBoxOuts;
        }
        curCo += nRealPos;
        Gia_ObjComputeTruthTableStop( p->pAigExtra );
        // verify counts
        assert( curCi == Gia_ManCiNum(p) );
        assert( curCo == Gia_ManCoNum(p) );
        assert( curCi - nRealPis == Gia_ManCoNum(p->pAigExtra) );
        assert( iBbIn  == nBbIns );
        assert( iBbOut == nBbOuts );
    }
    // finalize 
    Vec_IntFree( vLeaves );
    return Sfm_NtkConstruct( vFanins, nBbOuts + nRealPis, nRealPos + nBbIns, vFixed, vEmpty, vTruths, vStarts, vTruths2 );
}